

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O0

Locale * icu_63::Locale::getLocale(int locid)

{
  Locale *pLVar1;
  Locale *localeCache;
  int locid_local;
  
  pLVar1 = getLocaleCache();
  localeCache._4_4_ = locid;
  if (pLVar1 == (Locale *)0x0) {
    localeCache._4_4_ = 0;
  }
  return pLVar1 + localeCache._4_4_;
}

Assistant:

const Locale &
Locale::getLocale(int locid)
{
    Locale *localeCache = getLocaleCache();
    U_ASSERT((locid < eMAX_LOCALES)&&(locid>=0));
    if (localeCache == NULL) {
        // Failure allocating the locale cache.
        //   The best we can do is return a NULL reference.
        locid = 0;
    }
    return localeCache[locid]; /*operating on NULL*/
}